

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O3

void __thiscall CEAngle::SetAngle(CEAngle *this,char *angle_str,CEAngleType *angle_type,char *delim)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  reference __str;
  allocator *paVar4;
  long lVar5;
  invalid_delimiter *this_00;
  initializer_list<char> __l;
  char d;
  iterator __end4;
  vector<double,_std::allocator<double>_> angle_dbl;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  angle_vec;
  allocator local_c2;
  new_allocator<char> local_c1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c0;
  string local_b8;
  CEAngle *local_98;
  CEAngleType *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98 = this;
  local_90 = angle_type;
  if (*angle_type < HMS) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,angle_str,(allocator *)&local_88);
    local_68._M_dataplus._M_p = (pointer)std::__cxx11::stod(&local_b8,(size_t *)0x0);
    SetAngle(local_98,(double *)&local_68,local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_88);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_48,4);
    if (*delim == '\0') {
      local_b8._M_dataplus._M_p._0_2_ = 0x203a;
      std::allocator<char>::allocator();
      __l._M_len = 2;
      __l._M_array = (iterator)&local_b8;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_68,__l,(allocator_type *)&local_88);
      __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_88);
      local_88._M_dataplus._M_p =
           (pointer)std::vector<char,_std::allocator<char>_>::begin
                              ((vector<char,_std::allocator<char>_> *)&local_68);
      local_c0._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)&local_68);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                         &local_88,&local_c0);
      if (bVar2) {
        do {
          paVar4 = (allocator *)
                   __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *
                             )&local_88);
          local_c2 = *paVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_b8,angle_str,(allocator *)&local_c1);
          lVar5 = std::__cxx11::string::find((char)&local_b8,(ulong)(uint)(int)(char)local_c2);
          std::__cxx11::string::~string((string *)&local_b8);
          __gnu_cxx::new_allocator<char>::~new_allocator(&local_c1);
          if (lVar5 != -1) {
            SetAngle(local_98,angle_str,local_90,(char *)&local_c2);
          }
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     &local_88);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *
                             )&local_88,&local_c0);
        } while (bVar2);
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&local_68);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,angle_str,(allocator *)&local_68);
      CppEphem::StrOpt::split(&local_b8,delim,&local_48);
      std::__cxx11::string::~string((string *)&local_b8);
      __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_68);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_48);
      if (sVar3 < 3) {
        this_00 = (invalid_delimiter *)__cxa_allocate_exception(0xa8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b8,
                   "CEAngle::SetAngle(const string&, const CEAngleType&, const char&)",
                   (allocator *)&local_c0);
        cVar1 = *delim;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_88,1,cVar1,&local_c2);
        std::operator+(&local_68,"Could not find specified delimiter: ",&local_88);
        CEException::invalid_delimiter::invalid_delimiter(this_00,&local_b8,&local_68);
        __cxa_throw(this_00,&CEException::invalid_delimiter::typeinfo,
                    CEExceptionHandler::~CEExceptionHandler);
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_b8);
      local_68._M_dataplus._M_p =
           (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(&local_48);
      local_88._M_dataplus._M_p =
           (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(&local_48);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_68,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_88);
      if (bVar2) {
        do {
          __str = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_68);
          local_c0._M_current = (char *)std::__cxx11::stod(__str,(size_t *)0x0);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)&local_b8,
                     (value_type_conflict *)&local_c0);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_68);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_68,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_88);
        } while (bVar2);
      }
      SetAngle(local_98,(vector<double,_std::allocator<double>_> *)&local_b8,local_90);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&local_b8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  return;
}

Assistant:

void CEAngle::SetAngle(const char*        angle_str,
                       const CEAngleType& angle_type,
                       const char&        delim)
{
    // Angle is a degree or radian
    if ((angle_type == CEAngleType::DEGREES) || (angle_type == CEAngleType::RADIANS)) {
        SetAngle(std::stod(angle_str), angle_type);
    }

    // Otherwise the angle is a delimited string (i.e. something like HH:MM:SS)
    else {

        // Create a string vector to hold the parsed values
        std::vector<std::string> angle_vec;
        angle_vec.reserve(4);

        // Handle specific delimitors
        if (delim != 0) {

            // Split the string
            CppEphem::StrOpt::split(angle_str, delim, &angle_vec);

            // Throw an error if the string was not properly split
            if (angle_vec.size() < 3) {
                throw CEException::invalid_delimiter(
                    "CEAngle::SetAngle(const string&, const CEAngleType&, const char&)",
                    "Could not find specified delimiter: " + std::string(1,delim));
            }

            // Now format the string in the appropriate way
            std::vector<double> angle_dbl;
            for (auto& ang : angle_vec) {
                angle_dbl.push_back(std::stod(ang));
            }
            SetAngle(angle_dbl, angle_type);
        } 

        // Handle delimiter agnostic format
        else if (delim == 0) {

            // Create vector of delimiters to be tried
            std::vector<char> delim_list = {':', ' '};

            // Loop through the list of delimiters
            for (char d : delim_list) {
                // Check if the delimiter is in the string
                if (std::string(angle_str).find(d) != std::string::npos) {
                    // Try to set the angle
                    SetAngle(angle_str, angle_type, d);
                }
            }
        }
    }

    return;
}